

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_sse_sad(uint16_t *data,uint32_t len,uint32_t *flag_counts)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  byte bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  undefined1 (*pauVar9) [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar14 [16];
  
  if ((len & 0xffffffe0) == 0) {
    auVar26 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar17 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar27 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar23 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    pauVar9 = (undefined1 (*) [16])data;
  }
  else {
    auVar14[8] = 0x41;
    auVar14._0_8_ = 0x4141414141414141;
    auVar14[9] = 0x41;
    auVar14[10] = 0x41;
    auVar14[0xb] = 0x41;
    auVar14[0xc] = 0x41;
    auVar14[0xd] = 0x41;
    auVar14[0xe] = 0x41;
    auVar14[0xf] = 0x41;
    auVar16._8_4_ = 0x3f003f;
    auVar16._0_8_ = 0x3f003f003f003f;
    auVar16._12_4_ = 0x3f003f;
    auVar25[8] = 0x82;
    auVar25._0_8_ = 0x8282828282828282;
    auVar25[9] = 0x82;
    auVar25[10] = 0x82;
    auVar25[0xb] = 0x82;
    auVar25[0xc] = 0x82;
    auVar25[0xd] = 0x82;
    auVar25[0xe] = 0x82;
    auVar25[0xf] = 0x82;
    pauVar9 = (undefined1 (*) [16])(data + (len & 0xffffffe0));
    auVar24 = ZEXT1664((undefined1  [16])0x0);
    auVar29 = ZEXT1664((undefined1  [16])0x0);
    auVar22 = ZEXT1664((undefined1  [16])0x0);
    auVar28 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar15 = *(undefined1 (*) [16])data;
      pauVar1 = (undefined1 (*) [16])((long)data + 0x10);
      pauVar2 = (undefined1 (*) [16])((long)data + 0x20);
      pauVar3 = (undefined1 (*) [16])((long)data + 0x30);
      data = (uint16_t *)((long)data + 0x40);
      auVar35 = vpshufb_avx(auVar15,_DAT_00116010);
      auVar11 = vpshufb_avx(*pauVar1,_DAT_00116010);
      auVar6 = vpshufb_avx(*pauVar3,_DAT_00116010);
      auVar13 = vpshufb_avx(*pauVar2,_DAT_00116010);
      auVar15 = vpand_avx(auVar35,auVar14);
      auVar37 = vpand_avx(auVar11,auVar14);
      auVar36 = vpand_avx(auVar6,auVar14);
      auVar15 = vpsadbw_avx(auVar15,(undefined1  [16])0x0);
      auVar37 = vpsadbw_avx(auVar37,(undefined1  [16])0x0);
      auVar36 = vpsadbw_avx(auVar36,(undefined1  [16])0x0);
      auVar15 = vpaddw_avx(auVar37,auVar15);
      auVar37 = vpand_avx(auVar13,auVar14);
      auVar37 = vpsadbw_avx(auVar37,(undefined1  [16])0x0);
      auVar37 = vpaddw_avx(auVar37,auVar36);
      auVar36 = vpand_avx(auVar6,auVar25);
      auVar10 = vpshldw_avx512_vbmi2(auVar6,auVar6,0xc);
      auVar15 = vpaddw_avx(auVar15,auVar37);
      auVar36 = vpsadbw_avx(auVar36,(undefined1  [16])0x0);
      auVar37 = vpsrlw_avx(auVar15,6);
      auVar15 = vpand_avx(auVar15,auVar16);
      auVar15 = vpackssdw_avx(auVar37,auVar15);
      auVar37 = vpand_avx(auVar11,auVar25);
      auVar11 = vpshldw_avx512_vbmi2(auVar11,auVar11,0xc);
      auVar37 = vpsadbw_avx(auVar37,(undefined1  [16])0x0);
      auVar15 = vpaddd_avx(auVar15,auVar24._0_16_);
      auVar24 = ZEXT1664(auVar15);
      auVar23 = ZEXT1632(auVar15);
      auVar15 = vpand_avx(auVar35,auVar25);
      auVar12 = vpshldw_avx512_vbmi2(auVar35,auVar35,0xc);
      auVar15 = vpsadbw_avx(auVar15,(undefined1  [16])0x0);
      auVar15 = vpaddw_avx(auVar37,auVar15);
      auVar37 = vpand_avx(auVar13,auVar25);
      auVar13 = vpshldw_avx512_vbmi2(auVar13,auVar13,0xc);
      auVar37 = vpsadbw_avx(auVar37,(undefined1  [16])0x0);
      auVar37 = vpaddw_avx(auVar37,auVar36);
      auVar36 = vpand_avx(auVar10,auVar14);
      auVar15 = vpaddw_avx(auVar15,auVar37);
      auVar6 = vpsadbw_avx(auVar36,(undefined1  [16])0x0);
      auVar37 = vpavgb_avx(auVar15,(undefined1  [16])0x0);
      auVar36 = vpsrlw_avx(auVar15,7);
      auVar15 = vpand_avx(auVar37,auVar16);
      auVar15 = vpackssdw_avx(auVar36,auVar15);
      auVar37 = vpand_avx(auVar11,auVar14);
      auVar36 = vpand_avx(auVar11,auVar25);
      auVar35 = vpsadbw_avx(auVar37,(undefined1  [16])0x0);
      auVar11 = vpsadbw_avx(auVar36,(undefined1  [16])0x0);
      auVar15 = vpaddd_avx(auVar15,auVar29._0_16_);
      auVar29 = ZEXT1664(auVar15);
      auVar27 = ZEXT1632(auVar15);
      auVar15 = vpand_avx(auVar12,auVar14);
      auVar37 = vpand_avx(auVar12,auVar25);
      auVar15 = vpsadbw_avx(auVar15,(undefined1  [16])0x0);
      auVar37 = vpsadbw_avx(auVar37,(undefined1  [16])0x0);
      auVar15 = vpaddw_avx(auVar35,auVar15);
      auVar36 = vpand_avx(auVar13,auVar14);
      auVar37 = vpaddw_avx(auVar11,auVar37);
      auVar35 = vpand_avx(auVar13,auVar25);
      auVar11 = vpand_avx(auVar10,auVar25);
      auVar35 = vpsadbw_avx(auVar35,(undefined1  [16])0x0);
      auVar11 = vpsadbw_avx(auVar11,(undefined1  [16])0x0);
      auVar13 = vpsadbw_avx(auVar36,(undefined1  [16])0x0);
      auVar36 = vpaddw_avx(auVar35,auVar11);
      auVar35 = vpaddw_avx(auVar13,auVar6);
      auVar37 = vpaddw_avx(auVar37,auVar36);
      auVar15 = vpaddw_avx(auVar15,auVar35);
      auVar36 = vpavgb_avx(auVar37,(undefined1  [16])0x0);
      auVar11 = vpsrlw_avx(auVar15,6);
      auVar15 = vpand_avx(auVar15,auVar16);
      auVar35 = vpsrlw_avx(auVar37,7);
      auVar15 = vpackssdw_avx(auVar11,auVar15);
      auVar37 = vpand_avx(auVar36,auVar16);
      auVar37 = vpackssdw_avx(auVar35,auVar37);
      auVar15 = vpaddd_avx(auVar15,auVar22._0_16_);
      auVar22 = ZEXT1664(auVar15);
      auVar17 = ZEXT1632(auVar15);
      auVar15 = vpaddd_avx(auVar37,auVar28._0_16_);
      auVar28 = ZEXT1664(auVar15);
      auVar26 = ZEXT1632(auVar15);
    } while ((undefined1 (*) [16])data != pauVar9);
  }
  auVar15 = auVar27._0_16_;
  auVar25 = auVar26._0_16_;
  auVar30._0_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar25;
  auVar30._16_16_ = ZEXT116(0) * auVar26._16_16_ + ZEXT116(1) * auVar15;
  auVar16 = auVar23._0_16_;
  auVar14 = auVar17._0_16_;
  auVar32._0_16_ = ZEXT116(0) * auVar16 + ZEXT116(1) * auVar14;
  auVar32._16_16_ = ZEXT116(0) * auVar17._16_16_ + ZEXT116(1) * auVar16;
  auVar26._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar15;
  auVar26._16_16_ = ZEXT116(0) * auVar27._16_16_ + ZEXT116(1) * auVar25;
  auVar17._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar16;
  auVar17._16_16_ = ZEXT116(0) * auVar23._16_16_ + ZEXT116(1) * auVar14;
  auVar23 = vpunpckldq_avx2(auVar32,auVar30);
  auVar17 = vpunpckhdq_avx2(auVar17,auVar26);
  auVar26 = vpunpcklqdq_avx2(auVar17,auVar23);
  auVar17 = vpunpckhqdq_avx2(auVar17,auVar23);
  auVar22 = vinserti64x4_avx512f(ZEXT3264(auVar17),auVar26,1);
  auVar22 = vpaddd_avx512f(auVar22,*(undefined1 (*) [64])flag_counts);
  auVar22 = vmovdqu64_avx512f(auVar22);
  *(undefined1 (*) [64])flag_counts = auVar22;
  if ((len & 0x1f) != 0) {
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar24 = vpbroadcastq_avx512f(ZEXT816(0x5555));
    auVar28 = vpbroadcastq_avx512f(ZEXT816(0x40010004001));
    auVar29 = vpbroadcastq_avx512f(ZEXT816(0x101010101010101));
    auVar33 = ZEXT1664((undefined1  [16])0x0);
    auVar34 = ZEXT1664((undefined1  [16])0x0);
    auVar18 = vpbroadcastq_avx512f();
    uVar8 = 0;
    do {
      auVar19 = vmovdqa64_avx512f(auVar34);
      auVar34 = vpbroadcastq_avx512f();
      auVar20 = vmovdqa64_avx512f(auVar33);
      auVar33 = vporq_avx512f(auVar34,auVar22);
      uVar7 = vpcmpuq_avx512f(auVar33,auVar18,2);
      auVar14 = vmovdqu16_avx512vl(*(undefined1 (*) [16])(*pauVar9 + uVar8 * 2));
      bVar4 = (byte)uVar7;
      auVar15._2_2_ = (ushort)((byte)(uVar7 >> 1) & 1) * auVar14._2_2_;
      auVar15._0_2_ = (ushort)(bVar4 & 1) * auVar14._0_2_;
      auVar15._4_2_ = (ushort)((byte)(uVar7 >> 2) & 1) * auVar14._4_2_;
      auVar15._6_2_ = (ushort)((byte)(uVar7 >> 3) & 1) * auVar14._6_2_;
      auVar15._8_2_ = (ushort)((byte)(uVar7 >> 4) & 1) * auVar14._8_2_;
      auVar15._10_2_ = (ushort)((byte)(uVar7 >> 5) & 1) * auVar14._10_2_;
      auVar15._12_2_ = (ushort)((byte)(uVar7 >> 6) & 1) * auVar14._12_2_;
      auVar15._14_2_ = (ushort)(byte)(uVar7 >> 7) * auVar14._14_2_;
      uVar8 = uVar8 + 8;
      auVar33 = vpmovzxwq_avx512f(auVar15);
      auVar34 = vpandq_avx512f(auVar33,auVar24);
      auVar33 = vpsrlq_avx512f(auVar33,1);
      auVar33 = vpandq_avx512f(auVar33,auVar24);
      auVar34 = vpmullq_avx512dq(auVar34,auVar28);
      auVar33 = vpmullq_avx512dq(auVar33,auVar28);
      auVar34 = vpandq_avx512f(auVar34,auVar29);
      auVar21 = vpandq_avx512f(auVar33,auVar29);
      auVar33 = vpaddq_avx512f(auVar34,auVar20);
      auVar34 = vpaddq_avx512f(auVar21,auVar19);
    } while (((len & 0x1f) + 7 & 0xfffffff8) != uVar8);
    auVar24 = vmovdqa64_avx512f(auVar33);
    auVar22._0_8_ = (ulong)(bVar4 & 1) * auVar24._0_8_ | (ulong)!(bool)(bVar4 & 1) * auVar20._0_8_;
    bVar5 = (bool)((byte)(uVar7 >> 1) & 1);
    auVar22._8_8_ = (ulong)bVar5 * auVar24._8_8_ | (ulong)!bVar5 * auVar20._8_8_;
    bVar5 = (bool)((byte)(uVar7 >> 2) & 1);
    auVar22._16_8_ = (ulong)bVar5 * auVar24._16_8_ | (ulong)!bVar5 * auVar20._16_8_;
    bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
    auVar22._24_8_ = (ulong)bVar5 * auVar24._24_8_ | (ulong)!bVar5 * auVar20._24_8_;
    bVar5 = (bool)((byte)(uVar7 >> 4) & 1);
    auVar22._32_8_ = (ulong)bVar5 * auVar24._32_8_ | (ulong)!bVar5 * auVar20._32_8_;
    bVar5 = (bool)((byte)(uVar7 >> 5) & 1);
    auVar22._40_8_ = (ulong)bVar5 * auVar24._40_8_ | (ulong)!bVar5 * auVar20._40_8_;
    bVar5 = (bool)((byte)(uVar7 >> 6) & 1);
    auVar22._48_8_ = (ulong)bVar5 * auVar24._48_8_ | (ulong)!bVar5 * auVar20._48_8_;
    auVar22._56_8_ = (uVar7 >> 7) * auVar24._56_8_ | (ulong)!SUB81(uVar7 >> 7,0) * auVar20._56_8_;
    auVar17 = vextracti64x4_avx512f(auVar22,1);
    auVar24 = vmovdqa64_avx512f(auVar34);
    auVar28._0_8_ = (ulong)(bVar4 & 1) * auVar24._0_8_ | (ulong)!(bool)(bVar4 & 1) * auVar19._0_8_;
    bVar5 = (bool)((byte)(uVar7 >> 1) & 1);
    auVar28._8_8_ = (ulong)bVar5 * auVar24._8_8_ | (ulong)!bVar5 * auVar19._8_8_;
    bVar5 = (bool)((byte)(uVar7 >> 2) & 1);
    auVar28._16_8_ = (ulong)bVar5 * auVar24._16_8_ | (ulong)!bVar5 * auVar19._16_8_;
    bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
    auVar28._24_8_ = (ulong)bVar5 * auVar24._24_8_ | (ulong)!bVar5 * auVar19._24_8_;
    bVar5 = (bool)((byte)(uVar7 >> 4) & 1);
    auVar28._32_8_ = (ulong)bVar5 * auVar24._32_8_ | (ulong)!bVar5 * auVar19._32_8_;
    bVar5 = (bool)((byte)(uVar7 >> 5) & 1);
    auVar28._40_8_ = (ulong)bVar5 * auVar24._40_8_ | (ulong)!bVar5 * auVar19._40_8_;
    bVar5 = (bool)((byte)(uVar7 >> 6) & 1);
    auVar28._48_8_ = (ulong)bVar5 * auVar24._48_8_ | (ulong)!bVar5 * auVar19._48_8_;
    auVar28._56_8_ = (uVar7 >> 7) * auVar24._56_8_ | (ulong)!SUB81(uVar7 >> 7,0) * auVar19._56_8_;
    auVar22 = vpaddq_avx512f(auVar22,ZEXT3264(auVar17));
    auVar14 = vpaddq_avx(auVar22._0_16_,auVar22._16_16_);
    auVar16 = vpshufd_avx(auVar14,0xee);
    auVar14 = vpaddq_avx(auVar14,auVar16);
    auVar17 = vextracti64x4_avx512f(auVar28,1);
    auVar22 = vpaddq_avx512f(auVar28,ZEXT3264(auVar17));
    auVar16 = vpaddq_avx(auVar22._0_16_,auVar22._16_16_);
    auVar25 = vpshufd_avx(auVar16,0xee);
    auVar16 = vpaddq_avx(auVar16,auVar25);
    auVar15 = vpunpckldq_avx(auVar14,auVar16);
    auVar37 = vpunpcklqdq_avx(auVar14,auVar16);
    auVar25 = vpshufb_avx(auVar37,_DAT_00116030);
    auVar31._0_16_ = ZEXT116(0) * auVar37 + ZEXT116(1) * auVar37;
    auVar31._16_16_ = ZEXT116(1) * auVar37;
    auVar17 = vpsrlvq_avx2(auVar31,_DAT_00118fc0);
    auVar36 = vpsrld_avx(auVar15,8);
    auVar15 = vpshufb_avx(auVar15,_DAT_00116040);
    auVar37 = vpsrlq_avx(auVar37,0x38);
    auVar14 = vpinsrd_avx(auVar36,auVar14._0_4_,2);
    auVar14 = vpinsrd_avx(auVar14,auVar16._0_4_,3);
    auVar14 = vpshufb_avx(auVar14,_DAT_00116020);
    auVar16 = vpmovqd_avx512vl(auVar17);
    auVar27._0_16_ = ZEXT116(0) * auVar16 + ZEXT116(1) * auVar15;
    auVar27._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar16;
    auVar23._8_4_ = 0xff;
    auVar23._0_8_ = 0xff000000ff;
    auVar23._12_4_ = 0xff;
    auVar23._16_4_ = 0xff;
    auVar23._20_4_ = 0xff;
    auVar23._24_4_ = 0xff;
    auVar23._28_4_ = 0xff;
    auVar17 = vpandd_avx512vl(auVar27,auVar23);
    auVar22 = vinserti32x4_avx512f(ZEXT3264(auVar17),auVar14,2);
    auVar24 = vpmovsxbd_avx512f(_DAT_00116050);
    auVar22 = vinserti32x4_avx512f(auVar22,auVar25,3);
    auVar22 = vpermi2d_avx512f(auVar24,auVar22,ZEXT1664(auVar37));
    auVar22 = vpaddd_avx512f(auVar22,*(undefined1 (*) [64])flag_counts);
    auVar22 = vmovdqu64_avx512f(auVar22);
    *(undefined1 (*) [64])flag_counts = auVar22;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_sad(const uint16_t* data, uint32_t len, uint32_t* flag_counts) {
    const __m128i zero = _mm_setzero_si128();
    const __m128i mask_lo_byte = _mm_srli_epi16(_mm_cmpeq_epi8(zero, zero), 8);
    const __m128i mask_lo_cnt  = _mm_srli_epi16(mask_lo_byte, 2);
    const __m128i mask_bits_a  = _mm_set1_epi8(0x41); // 01000001
    const __m128i mask_bits_b  = _mm_add_epi8(mask_bits_a, mask_bits_a);
    uint32_t buffer[16];

    __m128i counterA = zero;
    __m128i counterB = zero;
    __m128i counterC = zero;
    __m128i counterD = zero;

    for (const uint16_t* end = &data[(len & ~31)]; data != end; data += 32) {
        __m128i r0 = _mm_loadu_si128((__m128i*)&data[0]);
        __m128i r1 = _mm_loadu_si128((__m128i*)&data[8]);
        __m128i r2 = _mm_loadu_si128((__m128i*)&data[16]);
        __m128i r3 = _mm_loadu_si128((__m128i*)&data[24]);
        __m128i r4, r5, r6, r7;

        // seperate LOBYTE and HIBYTE of each WORD
        // (emulate PSHUFB F,D,B,9,7,5,3,1, E,C,A,8,6,4,2,0)
        r4 = _mm_and_si128(mask_lo_byte, r0);
        r5 = _mm_and_si128(mask_lo_byte, r1);
        r6 = _mm_and_si128(mask_lo_byte, r2);
        r7 = _mm_and_si128(mask_lo_byte, r3);
        r0 = _mm_srli_epi16(r0, 8);
        r1 = _mm_srli_epi16(r1, 8);
        r2 = _mm_srli_epi16(r2, 8);
        r3 = _mm_srli_epi16(r3, 8);
        r0 = _mm_packus_epi16(r0, r4);
        r1 = _mm_packus_epi16(r1, r5);
        r2 = _mm_packus_epi16(r2, r6);
        r3 = _mm_packus_epi16(r3, r7);

        // isolate bits to count
        r4 = _mm_and_si128(mask_bits_a, r0);
        r5 = _mm_and_si128(mask_bits_a, r1);
        r6 = _mm_and_si128(mask_bits_a, r2);
        r7 = _mm_and_si128(mask_bits_a, r3);

        // horizontal sum of qwords
        r4 = _mm_sad_epu8(r4, zero);
        r5 = _mm_sad_epu8(r5, zero);
        r6 = _mm_sad_epu8(r6, zero);
        r7 = _mm_sad_epu8(r7, zero);

        // sum 6-bit counts
        r4 = _mm_add_epi16(r4,r5);
        r4 = _mm_add_epi16(r4,r6);
        r4 = _mm_add_epi16(r4,r7);

        // unpack 6-bit counts to 32-bits
        r5 = _mm_and_si128(mask_lo_cnt, r4);
        r4 = _mm_srli_epi16(r4, 6);
        r4 = _mm_packs_epi32(r4, r5);

        // accumulate
        counterA = _mm_add_epi32(counterA, r4);

        // do it again...
        r4 = _mm_and_si128(mask_bits_b, r0);
        r5 = _mm_and_si128(mask_bits_b, r1);
        r6 = _mm_and_si128(mask_bits_b, r2);
        r7 = _mm_and_si128(mask_bits_b, r3);

        r4 = _mm_sad_epu8(r4, zero);
        r5 = _mm_sad_epu8(r5, zero);
        r6 = _mm_sad_epu8(r6, zero);
        r7 = _mm_sad_epu8(r7, zero);

        r4 = _mm_add_epi16(r4,r5);
        r4 = _mm_add_epi16(r4,r6);
        r4 = _mm_add_epi16(r4,r7);

        r5 = _mm_avg_epu8(zero, r4); // shift right 1
        r5 = _mm_and_si128(r5, mask_lo_cnt);
        r4 = _mm_srli_epi16(r4, 7);
        r4 = _mm_packs_epi32(r4, r5);

        counterB = _mm_add_epi32(counterB, r4); // accumulate

        // rotate right 4
        r4 = _mm_slli_epi16(r0, 12);
        r5 = _mm_slli_epi16(r1, 12);
        r6 = _mm_slli_epi16(r2, 12);
        r7 = _mm_slli_epi16(r3, 12);
        r0 = _mm_srli_epi16(r0, 4);
        r1 = _mm_srli_epi16(r1, 4);
        r2 = _mm_srli_epi16(r2, 4);
        r3 = _mm_srli_epi16(r3, 4);
        r0 = _mm_or_si128(r0, r4);
        r1 = _mm_or_si128(r1, r5);
        r2 = _mm_or_si128(r2, r6);
        r3 = _mm_or_si128(r3, r7);

        // do it again...
        r4 = _mm_and_si128(mask_bits_a, r0);
        r5 = _mm_and_si128(mask_bits_a, r1);
        r6 = _mm_and_si128(mask_bits_a, r2);
        r7 = _mm_and_si128(mask_bits_a, r3);

        r4 = _mm_sad_epu8(r4, zero);
        r5 = _mm_sad_epu8(r5, zero);
        r6 = _mm_sad_epu8(r6, zero);
        r7 = _mm_sad_epu8(r7, zero);

        r4 = _mm_add_epi16(r4,r5);
        r4 = _mm_add_epi16(r4,r6);
        r4 = _mm_add_epi16(r4,r7);

        r5 = _mm_and_si128(mask_lo_cnt, r4);
        r4 = _mm_srli_epi16(r4, 6);
        r4 = _mm_packs_epi32(r4, r5);

        counterC = _mm_add_epi32(counterC, r4); // accumulate

        // do it again...
        r0 = _mm_and_si128(r0, mask_bits_b);
        r1 = _mm_and_si128(r1, mask_bits_b);
        r2 = _mm_and_si128(r2, mask_bits_b);
        r3 = _mm_and_si128(r3, mask_bits_b);

        r0 = _mm_sad_epu8(r0, zero);
        r1 = _mm_sad_epu8(r1, zero);
        r2 = _mm_sad_epu8(r2, zero);
        r3 = _mm_sad_epu8(r3, zero);

        r0 = _mm_add_epi16(r0,r1);
        r0 = _mm_add_epi16(r0,r2);
        r0 = _mm_add_epi16(r0,r3);

        r1 = _mm_avg_epu8(zero, r0);
        r1 = _mm_and_si128(r1, mask_lo_cnt);
        r0 = _mm_srli_epi16(r0, 7);
        r0 = _mm_packs_epi32(r0, r1);

        counterD = _mm_add_epi32(counterD, r0); // accumulate
    }

    // transpose then store counters
    __m128i counter_1098 = _mm_unpackhi_epi32(counterA, counterB);
    __m128i counter_76FE = _mm_unpacklo_epi32(counterA, counterB);
    __m128i counter_32BA = _mm_unpacklo_epi32(counterC, counterD);
    __m128i counter_54DC = _mm_unpackhi_epi32(counterC, counterD);
    __m128i counter_7654 = _mm_unpackhi_epi64(counter_54DC, counter_76FE);
    __m128i counter_FEDC = _mm_unpacklo_epi64(counter_54DC, counter_76FE);
    __m128i counter_3210 = _mm_unpackhi_epi64(counter_1098, counter_32BA);
    __m128i counter_BA98 = _mm_unpacklo_epi64(counter_1098, counter_32BA);

    
    _mm_storeu_si128((__m128i*)&buffer[0], counter_3210);
    _mm_storeu_si128((__m128i*)&buffer[4], counter_7654);
    _mm_storeu_si128((__m128i*)&buffer[8], counter_BA98);
    _mm_storeu_si128((__m128i*)&buffer[12], counter_FEDC);
    for (int i = 0; i < 16; ++i) flag_counts[i] += buffer[i];

    // scalar tail loop
    int tail = len & 31;
    if (tail != 0) {
        uint64_t countsA = 0;
        uint64_t countsB = 0;
        do {
            // zero-extend a bit to 8-bits then accumulate
            // (emulate pdep)
            const uint64_t mask_01 = UINT64_C(0x0101010101010101);// 100000001000000010000000100000001000000010000000100000001
            const uint64_t magic   = UINT64_C(0x0000040010004001);// 000000000000001000000000000010000000000000100000000000001
                                                                  // 1+(1<<14)+(1<<28)+(1<<42)
            uint64_t x = *data++;
            countsA += ((x & 0x5555) * magic) & mask_01; // 0101010101010101
            countsB += (((x >> 1) & 0x5555) * magic) & mask_01;
        } while (--tail);

        // transpose then store counters
        flag_counts[0]  += countsA & 0xFF;
        flag_counts[8]  += (countsA >>  8) & 0xFF;
        flag_counts[2]  += (countsA >> 16) & 0xFF;
        flag_counts[10] += (countsA >> 24) & 0xFF;
        flag_counts[4]  += (countsA >> 32) & 0xFF;
        flag_counts[12] += (countsA >> 40) & 0xFF;
        flag_counts[6]  += (countsA >> 48) & 0xFF;
        flag_counts[14] += (countsA >> 56) & 0xFF;
        flag_counts[1]  += countsB & 0xFF;
        flag_counts[9]  += (countsB >>  8) & 0xFF;
        flag_counts[3]  += (countsB >> 16) & 0xFF;
        flag_counts[11] += (countsB >> 24) & 0xFF;
        flag_counts[5]  += (countsB >> 32) & 0xFF;
        flag_counts[13] += (countsB >> 40) & 0xFF;
        flag_counts[7]  += (countsB >> 48) & 0xFF;
        flag_counts[15] += (countsB >> 56) & 0xFF;
    }

    return 0;
}